

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

void deserialize_model<std::istream,int,unsigned_long>
               (ExtIsoForest *model,basic_istream<char,_std::char_traits<char>_> *in,
               vector<char,_std::allocator<char>_> *buffer,bool diff_endian,bool lacks_range_penalty
               ,bool lacks_scoring_metric)

{
  IsoHPlane *pIVar1;
  IsoHPlane *node;
  IsoHPlane *node_00;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *__range2;
  pointer this;
  ulong uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer_;
  size_t veclen;
  size_t data_sizets [2];
  double data_doubles [2];
  undefined1 local_88 [16];
  pointer local_78;
  size_type local_70;
  size_t local_68;
  size_type local_60;
  pointer local_58;
  vector<char,_std::allocator<char>_> *local_50;
  double local_48;
  double dStack_40;
  
  if (!interrupt_switch) {
    local_50 = buffer;
    if (lacks_range_penalty) {
      read_bytes<unsigned_char>(local_88,3,in);
      uVar2 = (ulong)CONCAT14(local_88[1],(uint)(local_88._0_2_ & 0xff));
      model->new_cat_action = (int)uVar2;
      model->cat_split_type = (int)(uVar2 >> 0x20);
      model->missing_action = (uint)local_88[2];
    }
    else {
      read_bytes<unsigned_char>(local_88,4,in);
      uVar2 = (ulong)CONCAT14(local_88[1],(uint)(local_88._0_2_ & 0xff));
      model->new_cat_action = (int)uVar2;
      model->cat_split_type = (int)(uVar2 >> 0x20);
      model->missing_action = (uint)local_88[2];
      model->has_range_penalty = local_88[3] != '\0';
    }
    if (lacks_scoring_metric) {
      model->scoring_metric = Depth;
    }
    else {
      read_bytes<unsigned_char>(local_88,1,in);
      model->scoring_metric = (uint)local_88[0];
    }
    read_bytes<double>(&local_48,2,in);
    if (diff_endian) {
      deserialize_model<std::istream,int,unsigned_long>();
    }
    else {
      model->exp_avg_depth = local_48;
      model->exp_avg_sep = dStack_40;
      read_bytes<unsigned_long>(&local_68,2,in);
    }
    model->orig_sample_size = local_68;
    std::
    vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
    ::resize(&model->hplanes,local_60);
    if ((model->hplanes).
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
        (model->hplanes).
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      __shrink_to_fit_aux<std::vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>,_true>
      ::_S_do_it(&model->hplanes);
    }
    local_88 = (undefined1  [16])0x0;
    local_78 = (pointer)0x0;
    this = (model->hplanes).
           super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    local_58 = (model->hplanes).
               super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (this != local_58) {
      do {
        read_bytes<unsigned_long>(&local_70,1,in);
        if (diff_endian) {
          swap_endianness<unsigned_long>(&local_70,1);
        }
        std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::resize(this,local_70);
        if ((this->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage !=
            (this->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          std::__shrink_to_fit_aux<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_true>::
          _S_do_it(this);
        }
        pIVar1 = (this->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (node_00 = (this->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                       super__Vector_impl_data._M_start; node_00 != pIVar1; node_00 = node_00 + 1) {
          deserialize_node<std::istream,int,unsigned_long>
                    (node_00,in,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88,
                     local_50,diff_endian);
        }
        this = this + 1;
      } while (this != local_58);
    }
    if ((pointer)local_88._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_88._0_8_,(long)local_78 - local_88._0_8_);
    }
  }
  return;
}

Assistant:

void deserialize_model(ExtIsoForest &model, itype &in, std::vector<char> &buffer,
                       const bool diff_endian, const bool lacks_range_penalty,
                       const bool lacks_scoring_metric)
{
    if (interrupt_switch) return;

    if (lacks_range_penalty)
    {
        uint8_t data_en[3];
        read_bytes<uint8_t>((void*)data_en, (size_t)3, in);
        model.new_cat_action = (NewCategAction)data_en[0];
        model.cat_split_type = (CategSplit)data_en[1];
        model.missing_action = (MissingAction)data_en[2];
    }

    else
    {
        uint8_t data_en[4];
        read_bytes<uint8_t>((void*)data_en, (size_t)4, in);
        model.new_cat_action = (NewCategAction)data_en[0];
        model.cat_split_type = (CategSplit)data_en[1];
        model.missing_action = (MissingAction)data_en[2];
        model.has_range_penalty = (bool)data_en[3];
    }

    if (lacks_scoring_metric)
    {
        model.scoring_metric = Depth;
    }

    else
    {
        uint8_t data_en;
        read_bytes<uint8_t>((void*)&data_en, (size_t)1, in);
        model.scoring_metric = (ScoringMetric)data_en;
    }

    double data_doubles[2];
    read_bytes<double, double>((void*)data_doubles, (size_t)2, in, buffer, diff_endian);
    model.exp_avg_depth = data_doubles[0];
    model.exp_avg_sep = data_doubles[1];

    size_t data_sizets[2];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)2, in, buffer, diff_endian);
    model.orig_sample_size = data_sizets[0];
    model.hplanes.resize(data_sizets[1]);
    model.hplanes.shrink_to_fit();

    size_t veclen;
    std::vector<uint8_t> buffer_;
    for (auto &tree : model.hplanes) {
        read_bytes<size_t, saved_size_t>((void*)&veclen, (size_t)1, in, buffer, diff_endian);
        tree.resize(veclen);
        tree.shrink_to_fit();
        for (auto &node : tree)
            deserialize_node<itype, saved_int_t, saved_size_t>(node, in, buffer_, buffer, diff_endian);
    }
}